

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<long>::InternalSwap
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  int iVar1;
  LogMessage *pLVar2;
  Rep *pRVar3;
  Rep *pRVar4;
  Arena *pAVar5;
  Arena *pAVar6;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e8);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  pRVar3 = this->rep_;
  if (pRVar3 == (Rep *)0x0) {
    pAVar5 = (Arena *)0x0;
  }
  else {
    pAVar5 = pRVar3->arena;
  }
  pRVar4 = other->rep_;
  if (pRVar4 == (Rep *)0x0) {
    pAVar6 = (Arena *)0x0;
  }
  else {
    pAVar6 = pRVar4->arena;
  }
  if (pAVar5 != pAVar6) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e9);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: GetArenaNoVirtual() == other->GetArenaNoVirtual(): ");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
    pRVar3 = this->rep_;
    pRVar4 = other->rep_;
  }
  this->rep_ = pRVar4;
  other->rep_ = pRVar3;
  iVar1 = this->current_size_;
  this->current_size_ = other->current_size_;
  other->current_size_ = iVar1;
  iVar1 = this->total_size_;
  this->total_size_ = other->total_size_;
  other->total_size_ = iVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::InternalSwap(RepeatedField* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());

  std::swap(rep_, other->rep_);
  std::swap(current_size_, other->current_size_);
  std::swap(total_size_, other->total_size_);
}